

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O1

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::add_srv(raft_server *this,srv_config *srv)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  ptr<cmd_result<ptr<buffer>_>_> pVar2;
  ptr<req_msg> req;
  ptr<log_entry> log;
  ptr<buffer> buf;
  log_val_type local_79;
  _Any_data local_78;
  value_type local_68;
  _Alloc_hider local_50;
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  _Alloc_hider _Stack_30;
  size_type local_28;
  undefined8 uStack_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  srv_config::serialize((srv_config *)&stack0xffffffffffffffa8);
  local_48 = (ulong)local_48._4_4_ << 0x20;
  local_79 = cluster_server;
  local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
            (&local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(log_entry **)&local_68,(allocator<nuraft::log_entry> *)&local_78,(int *)&local_48,
             (shared_ptr<nuraft::buffer> *)&stack0xffffffffffffffa8,&local_79);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = operator_new(0x60);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00236430;
  local_78._M_unused._0_8_ = (undefined8)(local_78._8_8_ + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x10))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x10))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x20))->_vptr__Sp_counted_base
       = (_func_int **)0x6;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x20))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x10))->_vptr__Sp_counted_base
       = (_func_int **)&PTR__req_msg_00236480;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x30))->_vptr__Sp_counted_base
       = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x30))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x30))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x40))->_vptr__Sp_counted_base
       = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x40))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x40))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x50))->_vptr__Sp_counted_base
       = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x50))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x50))->_M_weak_count = 0;
  std::
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>::
  push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x40))->
                _M_use_count,&local_68);
  local_28 = 0;
  uStack_20 = 0;
  aStack_40._8_8_ = (code *)0x0;
  _Stack_30._M_p = (pointer)0x0;
  local_48 = 0;
  aStack_40._M_allocated_capacity = 0;
  pVar2 = send_msg_to_leader(this,(ptr<req_msg> *)srv,(req_ext_params *)&local_78);
  _Var1 = pVar2.
          super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi;
  if ((code *)aStack_40._8_8_ != (code *)0x0) {
    (*(code *)aStack_40._8_8_)(&local_48,&local_48,3);
    _Var1._M_pi = extraout_RDX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_p);
    _Var1._M_pi = extraout_RDX_02;
  }
  pVar2.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  pVar2.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar2.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > > raft_server::add_srv(const srv_config& srv)
{
    ptr<buffer> buf(srv.serialize());
    ptr<log_entry> log( cs_new<log_entry>
                        ( 0, buf, log_val_type::cluster_server ) );
    ptr<req_msg> req = cs_new<req_msg>
                       ( (ulong)0, msg_type::add_server_request, 0, 0,
                         (ulong)0, (ulong)0, (ulong)0 );
    req->log_entries().push_back(log);
    return send_msg_to_leader(req);
}